

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  int iVar2;
  long in_RDI;
  string_view sVar3;
  undefined1 in_stack_00000000 [16];
  bin_writer<3> in_stack_00000010;
  int num_digits;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  internal *this_00;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  long lVar5;
  
  this_00 = *(internal **)(in_RDI + 0x10);
  sVar4 = *(size_t *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff30;
  n._0_8_ = in_stack_ffffffffffffff28;
  lVar5 = in_RDI;
  iVar2 = count_digits<3u,unsigned__int128>(this_00,(unsigned___int128)n);
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) &&
     (*(long *)(in_RDI + 0x10) != 0 || *(long *)(in_RDI + 0x18) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar1 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar1) = 0x30;
  }
  sVar3 = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1ccd72);
  prefix.size_ = sVar4;
  prefix.data_ = (char *)this_00;
  specs.precision = iVar2;
  specs.width = in_stack_fffffffffffffff0;
  specs.type = (char)lVar5;
  specs._9_3_ = (int3)((ulong)lVar5 >> 8);
  specs.fill.data_[0] = (int)((ulong)lVar5 >> 0x20);
  specs.fill._4_16_ = in_stack_00000000;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar3.size_,sVar3.data_._4_4_,prefix,
             specs,in_stack_00000010);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }